

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_ctr.c
# Opt level: O0

void beltCTRStart(void *state,octet *key,size_t len,octet *iv)

{
  u32 *in_RCX;
  u32 *in_RDI;
  belt_ctr_st *st;
  
  beltKeyExpand2(in_RCX,(octet *)in_RDI,0x146604);
  u32From(in_RCX,in_RDI,0x14661b);
  beltBlockEncr2(in_RDI + 8,in_RDI);
  in_RDI[0x10] = 0;
  in_RDI[0x11] = 0;
  return;
}

Assistant:

void beltCTRStart(void* state, const octet key[], size_t len, 
	const octet iv[16])
{
	belt_ctr_st* st = (belt_ctr_st*)state;
	ASSERT(memIsDisjoint2(iv, 16, state, beltCTR_keep()));
	beltKeyExpand2(st->key, key, len);
	u32From(st->ctr, iv, 16);
	beltBlockEncr2(st->ctr, st->key);
	st->reserved = 0;
}